

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

void nsync::nsync_waiter_free_(waiter *w)

{
  uint uVar1;
  
  uVar1 = w->flags;
  if ((uVar1 & 2) == 0) {
    _DAT_00000000 = 0;
  }
  w->flags = uVar1 & 0xfffffffd;
  if ((uVar1 & 1) == 0) {
    uVar1 = 0;
    while ((free_waiters_mu & 1) != 0) {
      uVar1 = nsync_spin_delay_(uVar1);
    }
    free_waiters_mu = free_waiters_mu | 1;
    LOCK();
    UNLOCK();
    free_waiters = nsync_dll_make_first_in_list_(free_waiters,&(w->nw).q);
    free_waiters_mu = 0;
  }
  return;
}

Assistant:

void nsync_waiter_free_ (waiter *w) {
	ASSERT ((w->flags & WAITER_IN_USE) != 0);
	w->flags &= ~WAITER_IN_USE;
	if ((w->flags & WAITER_RESERVED) == 0) {
		nsync_spin_test_and_set_ (&free_waiters_mu, 1, 1, 0);
		free_waiters = nsync_dll_make_first_in_list_ (free_waiters, &w->nw.q);
		ATM_STORE_REL (&free_waiters_mu, 0); /* release store */
	}
}